

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDComponentLocation __thiscall
ON_SubDMeshFragmentIterator::SubDAppearance(ON_SubDMeshFragmentIterator *this)

{
  element_type *peVar1;
  ON_SubDComponentLocation OVar2;
  ON_SubD *pOVar3;
  ON_SubDComponentLocation *pOVar4;
  
  OVar2 = this->m_subd_appearance_override;
  if (1 < (byte)(OVar2 - ControlNet)) {
    pOVar3 = SubD(this);
    peVar1 = (pOVar3->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 == (element_type *)0x0) {
      pOVar4 = &ON_SubD::DefaultSubDAppearance;
    }
    else {
      pOVar4 = &peVar1->m_subd_appearance;
    }
    OVar2 = *pOVar4;
  }
  return OVar2;
}

Assistant:

ON_SubDComponentLocation ON_SubDMeshFragmentIterator::SubDAppearance() const
{
  return 
    (ON_SubDComponentLocation::Surface == m_subd_appearance_override || ON_SubDComponentLocation::ControlNet == m_subd_appearance_override)
    ? m_subd_appearance_override
    : SubD().SubDAppearance();
}